

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walkExpr(Walker *pWalker,Expr *pExpr)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  Walker *in_RSI;
  long in_RDI;
  Window *pWin;
  int rc;
  Expr *pExpr_00;
  uint in_stack_ffffffffffffffe0;
  
  while( true ) {
    uVar2 = (**(code **)(in_RDI + 8))(in_RDI,in_RSI);
    if (uVar2 != 0) {
      return uVar2 & 2;
    }
    if (((ulong)in_RSI->pParse & 0x80400000000000) != 0) {
      return 0;
    }
    if ((in_RSI->xSelectCallback != (_func_int_Walker_ptr_Select_ptr *)0x0) &&
       (iVar3 = walkExpr(in_RSI,(Expr *)(ulong)in_stack_ffffffffffffffe0), iVar3 != 0)) {
      return 2;
    }
    if (in_RSI->xSelectCallback2 == (_func_void_Walker_ptr_Select_ptr *)0x0) break;
    in_RSI = (Walker *)in_RSI->xSelectCallback2;
  }
  if (((ulong)in_RSI->pParse & 0x80000000000) == 0) {
    lVar1._0_4_ = in_RSI->walkerDepth;
    lVar1._4_1_ = in_RSI->eCode;
    lVar1._5_3_ = *(undefined3 *)&in_RSI->field_0x25;
    if ((lVar1 != 0) &&
       (iVar3 = sqlite3WalkExprList(in_RSI,(ExprList *)CONCAT44(uVar2,in_stack_ffffffffffffffe0)),
       iVar3 != 0)) {
      return 2;
    }
  }
  else {
    iVar3 = sqlite3WalkSelect(in_RSI,(Select *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
    if (iVar3 != 0) {
      return 2;
    }
  }
  if (((ulong)in_RSI->pParse & 0x100000000000000) == 0) {
    return 0;
  }
  pExpr_00 = (Expr *)in_RSI[1].xSelectCallback;
  iVar3 = sqlite3WalkExprList(in_RSI,(ExprList *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
  if (iVar3 == 0) {
    iVar3 = sqlite3WalkExprList(in_RSI,(ExprList *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
    if (iVar3 != 0) {
      return 2;
    }
    iVar3 = sqlite3WalkExpr((Walker *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),pExpr_00);
    if (iVar3 == 0) {
      return 0;
    }
    return 2;
  }
  return 2;
}

Assistant:

static SQLITE_NOINLINE int walkExpr(Walker *pWalker, Expr *pExpr){
  int rc;
  testcase( ExprHasProperty(pExpr, EP_TokenOnly) );
  testcase( ExprHasProperty(pExpr, EP_Reduced) );
  while(1){
    rc = pWalker->xExprCallback(pWalker, pExpr);
    if( rc ) return rc & WRC_Abort;
    if( !ExprHasProperty(pExpr,(EP_TokenOnly|EP_Leaf)) ){
      if( pExpr->pLeft && walkExpr(pWalker, pExpr->pLeft) ) return WRC_Abort;
       assert( pExpr->x.pList==0 || pExpr->pRight==0 );
      if( pExpr->pRight ){
        pExpr = pExpr->pRight;
        continue;
      }else if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        if( sqlite3WalkSelect(pWalker, pExpr->x.pSelect) ) return WRC_Abort;
      }else if( pExpr->x.pList ){
        if( sqlite3WalkExprList(pWalker, pExpr->x.pList) ) return WRC_Abort;
      }
#ifndef SQLITE_OMIT_WINDOWFUNC
      if( ExprHasProperty(pExpr, EP_WinFunc) ){
        Window *pWin = pExpr->y.pWin;
        if( sqlite3WalkExprList(pWalker, pWin->pPartition) ) return WRC_Abort;
        if( sqlite3WalkExprList(pWalker, pWin->pOrderBy) ) return WRC_Abort;
        if( sqlite3WalkExpr(pWalker, pWin->pFilter) ) return WRC_Abort;
      }
#endif
    }
    break;
  }
  return WRC_Continue;
}